

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O0

bool spvOpcodeIsAbort(Op opcode)

{
  bool local_9;
  Op opcode_local;
  
  if ((((opcode == OpKill) || (opcode == OpUnreachable)) || (opcode == OpTerminateInvocation)) ||
     ((opcode - OpIgnoreIntersectionKHR < 2 || (opcode == OpEmitMeshTasksEXT)))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool spvOpcodeIsAbort(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpKill:
    case spv::Op::OpUnreachable:
    case spv::Op::OpTerminateInvocation:
    case spv::Op::OpTerminateRayKHR:
    case spv::Op::OpIgnoreIntersectionKHR:
    case spv::Op::OpEmitMeshTasksEXT:
      return true;
    default:
      return false;
  }
}